

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_planesurface.cpp
# Opt level: O0

bool __thiscall
ON_PlaneSurface::SetExtents(ON_PlaneSurface *this,int dir,ON_Interval extents,bool bSyncDomain)

{
  bool bVar1;
  bool bSyncDomain_local;
  int dir_local;
  ON_PlaneSurface *this_local;
  ON_Interval extents_local;
  
  extents_local.m_t[0] = extents.m_t[1];
  this_local = extents.m_t[0];
  if (((-1 < dir) && (dir < 2)) &&
     (bVar1 = ON_Interval::IsIncreasing((ON_Interval *)&this_local), bVar1)) {
    *(ON_PlaneSurface **)(&this->field_0xb0 + (long)dir * 0x10) = this_local;
    *(double *)((long)(&this->field_0xb0 + (long)dir * 0x10) + 8) = extents_local.m_t[0];
    if (bSyncDomain) {
      *(undefined8 *)(&this->field_0x90 + (long)dir * 0x10) =
           *(undefined8 *)(&this->field_0xb0 + (long)dir * 0x10);
      *(undefined8 *)((long)(&this->field_0x90 + (long)dir * 0x10) + 8) =
           *(undefined8 *)((long)(&this->field_0xb0 + (long)dir * 0x10) + 8);
    }
    return true;
  }
  return false;
}

Assistant:

bool ON_PlaneSurface::SetExtents( 
       int dir,
       ON_Interval extents,
       bool bSyncDomain
       )
{
  if ( dir < 0 || dir > 1 || !extents.IsIncreasing() )
    return false;
  m_extents[dir] = extents;
  if ( bSyncDomain )
    m_domain[dir] = m_extents[dir];
  return true;
}